

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall
fixedPreciseMeasurement_invalid_Test::~fixedPreciseMeasurement_invalid_Test
          (fixedPreciseMeasurement_invalid_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, invalid)
{
    fixed_precise_measurement iv1(1.2, precise::invalid);
    EXPECT_FALSE(is_valid(iv1));
    EXPECT_FALSE(isnormal(iv1));

    fixed_precise_measurement iv2(constants::invalid_conversion, precise::m);
    EXPECT_FALSE(is_valid(iv2));
    EXPECT_FALSE(isnormal(iv2));

    fixed_precise_measurement iv3(constants::infinity, precise::m);
    EXPECT_TRUE(is_valid(iv3));
    EXPECT_FALSE(isnormal(iv3));

    fixed_precise_measurement iv4(1e-311, precise::m);  // subnormal
    EXPECT_TRUE(is_valid(iv4));
    EXPECT_FALSE(isnormal(iv4));

    fixed_precise_measurement iv5(0.0, precise::m);
    EXPECT_TRUE(is_valid(iv5));
    EXPECT_TRUE(isnormal(iv5));
}